

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_ref.cpp
# Opt level: O0

ON_SubDComponentRef * __thiscall
ON_SubDComponentRef::operator=(ON_SubDComponentRef *this,ON_SubDComponentRef *src)

{
  ON_SubDComponentRef *src_local;
  ON_SubDComponentRef *this_local;
  
  if (this != src) {
    ON_Geometry::operator=(&this->super_ON_Geometry,&src->super_ON_Geometry);
    ON_SubDRef::operator=(&this->m_subd_ref,&src->m_subd_ref);
    (this->m_component_ptr).m_ptr = (src->m_component_ptr).m_ptr;
    this->m_component_index = src->m_component_index;
    this->m_component_location = src->m_component_location;
    this->m_reference_id = src->m_reference_id;
  }
  return this;
}

Assistant:

ON_SubDComponentRef& ON_SubDComponentRef::operator=(const ON_SubDComponentRef& src)
{
  if (this != &src)
  {
    ON_Geometry::operator=(src);
    m_subd_ref = src.m_subd_ref;
    m_component_ptr = src.m_component_ptr;
    m_component_index = src.m_component_index;
    m_component_location = src.m_component_location;
    m_reference_id = src.m_reference_id;
  }
  return *this;
}